

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeFirst(BtCursor *pCur,int *pRes)

{
  int local_1c;
  int rc;
  int *pRes_local;
  BtCursor *pCur_local;
  
  local_1c = moveToRoot(pCur);
  if (local_1c == 0) {
    if (pCur->eState == '\0') {
      *pRes = 1;
    }
    else {
      *pRes = 0;
      local_1c = moveToLeftmost(pCur);
    }
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeFirst(BtCursor *pCur, int *pRes){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    if( pCur->eState==CURSOR_INVALID ){
      assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
      *pRes = 1;
    }else{
      assert( pCur->apPage[pCur->iPage]->nCell>0 );
      *pRes = 0;
      rc = moveToLeftmost(pCur);
    }
  }
  return rc;
}